

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::PortConnection::ConnMap::ConnMap
          (ConnMap *this,SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *portConnections,
          Scope *scope,LookupLocation lookupLocation)

{
  undefined1 *puVar1;
  char *pcVar2;
  SyntaxKind SVar3;
  NamedParamAssignmentSyntax *this_00;
  ulong uVar4;
  int iVar5;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  uint64_t hash;
  Diagnostic *pDVar10;
  SourceLocation SVar11;
  bool bVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong pos0;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  byte bVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  byte bVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  byte bVar35;
  SourceRange SVar36;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar37;
  LookupLocation lookupLocation_00;
  try_emplace_args_t local_109;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_108;
  Scope *local_100;
  arrays_type *local_f8;
  string_view name;
  PortConnectionSyntax *conn;
  long local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  uint64_t local_a8;
  long local_a0;
  ulong local_98;
  long *local_90;
  char *local_88;
  Scope *local_80;
  pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> local_78;
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  byte bStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  byte bStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  locator res;
  
  local_80 = lookupLocation.scope;
  lookupLocation_00.index = lookupLocation.index;
  local_88 = (this->orderedConns).super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>
             .firstElement;
  (this->orderedConns).super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.data_ =
       (pointer)local_88;
  (this->orderedConns).super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.len = 0;
  (this->orderedConns).super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.cap = 5;
  (this->namedConns).super_Storage.ptr = (char *)&this->namedConns;
  *(NamedConnMap **)&(this->namedConns).super_Storage.field_0x108 = &this->namedConns;
  *(undefined8 *)&(this->namedConns).field_0x110 = 0x3f;
  *(undefined8 *)&(this->namedConns).field_0x118 = 1;
  *(undefined1 (*) [16])&(this->namedConns).field_0x120 = (undefined1  [16])0x0;
  *(undefined1 **)&(this->namedConns).field_0x120 =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  *(undefined1 (*) [16])&(this->namedConns).field_0x130 = (undefined1  [16])0x0;
  (this->wildcardAttrs)._M_ptr = (pointer)0x0;
  (this->wildcardAttrs)._M_extent = 0;
  (this->wildcardRange).startLoc = (SourceLocation)0x0;
  (this->wildcardRange).endLoc = (SourceLocation)0x0;
  this->usingOrdered = true;
  this->hasWildcard = false;
  uVar17 = (portConnections->elements)._M_extent._M_extent_value + 1;
  if (1 < uVar17) {
    local_108 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                &(this->namedConns).super_Storage.field_0x108;
    local_f8 = (arrays_type *)&(this->namedConns).field_0x110;
    local_90 = (long *)&(this->namedConns).field_0x120;
    bVar6 = false;
    uVar18 = 0;
    local_100 = scope;
    do {
      ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((portConnections->elements)._M_ptr + uVar18 * 2));
      this_00 = (NamedParamAssignmentSyntax *)*ppSVar9;
      SVar3 = (this_00->super_ParamAssignmentSyntax).super_SyntaxNode.kind;
      bVar12 = SVar3 == EmptyPortConnection || SVar3 == OrderedPortConnection;
      conn = (PortConnectionSyntax *)this_00;
      if (bVar6) {
        if (this->usingOrdered != bVar12) {
          res._0_16_ = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)this_00);
          SVar11 = parsing::Token::location((Token *)&res);
          Scope::addDiag(local_100,(DiagCode)0x800006,SVar11);
          return;
        }
      }
      else {
        this->usingOrdered = bVar12;
      }
      if (SVar3 == EmptyPortConnection) {
LAB_003fa37a:
        SmallVectorBase<slang::syntax::PortConnectionSyntax_const*>::
        emplace_back<slang::syntax::PortConnectionSyntax_const*const&>
                  ((SmallVectorBase<slang::syntax::PortConnectionSyntax_const*> *)this,&conn);
      }
      else if (SVar3 == WildcardPortConnection) {
        bVar6 = this->hasWildcard;
        this->hasWildcard = true;
        if (bVar6 == false) {
          SVar36 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
          this->wildcardRange = SVar36;
          syntax._M_ptr =
               (conn->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax._M_extent._M_extent_value =
               (conn->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          lookupLocation_00.scope = local_80;
          lookupLocation_00._12_4_ = 0;
          sVar37 = AttributeSymbol::fromSyntax(syntax,local_100,lookupLocation_00);
          this->wildcardAttrs = sVar37;
        }
        else {
          SVar36 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
          pDVar10 = Scope::addDiag(local_100,(DiagCode)0x340006,SVar36);
          Diagnostic::addNote(pDVar10,(DiagCode)0xc0001,this->wildcardRange);
        }
      }
      else {
        if (SVar3 == OrderedPortConnection) goto LAB_003fa37a;
        name = parsing::Token::valueText((Token *)(this_00 + 1));
        if (name._M_len != 0) {
          local_78.second = false;
          local_78.first = this_00;
          hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           (local_108,&name);
          uVar16 = hash >> ((byte)local_f8->groups_size_index & 0x3f);
          lVar14 = (hash & 0xff) * 4;
          cVar20 = (&UNK_00461acc)[lVar14];
          cVar21 = (&UNK_00461acd)[lVar14];
          cVar22 = (&UNK_00461ace)[lVar14];
          bVar23 = (&UNK_00461acf)[lVar14];
          uVar13 = (ulong)((uint)hash & 7);
          uVar15 = 0;
          pos0 = uVar16;
          cVar24 = cVar20;
          cVar25 = cVar21;
          cVar26 = cVar22;
          bVar27 = bVar23;
          cVar28 = cVar20;
          cVar29 = cVar21;
          cVar30 = cVar22;
          bVar31 = bVar23;
          cVar32 = cVar20;
          cVar33 = cVar21;
          cVar34 = cVar22;
          bVar35 = bVar23;
          do {
            pcVar2 = (char *)(*local_90 + uVar16 * 0x10);
            local_58 = *pcVar2;
            cStack_57 = pcVar2[1];
            cStack_56 = pcVar2[2];
            bStack_55 = pcVar2[3];
            cStack_54 = pcVar2[4];
            cStack_53 = pcVar2[5];
            cStack_52 = pcVar2[6];
            bStack_51 = pcVar2[7];
            cStack_50 = pcVar2[8];
            cStack_4f = pcVar2[9];
            cStack_4e = pcVar2[10];
            bStack_4d = pcVar2[0xb];
            cStack_4c = pcVar2[0xc];
            cStack_4b = pcVar2[0xd];
            cStack_4a = pcVar2[0xe];
            bVar7 = pcVar2[0xf];
            auVar19[0] = -(local_58 == cVar20);
            auVar19[1] = -(cStack_57 == cVar21);
            auVar19[2] = -(cStack_56 == cVar22);
            auVar19[3] = -(bStack_55 == bVar23);
            auVar19[4] = -(cStack_54 == cVar24);
            auVar19[5] = -(cStack_53 == cVar25);
            auVar19[6] = -(cStack_52 == cVar26);
            auVar19[7] = -(bStack_51 == bVar27);
            auVar19[8] = -(cStack_50 == cVar28);
            auVar19[9] = -(cStack_4f == cVar29);
            auVar19[10] = -(cStack_4e == cVar30);
            auVar19[0xb] = -(bStack_4d == bVar31);
            auVar19[0xc] = -(cStack_4c == cVar32);
            auVar19[0xd] = -(cStack_4b == cVar33);
            auVar19[0xe] = -(cStack_4a == cVar34);
            auVar19[0xf] = -(bVar7 == bVar35);
            uVar8 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
            bStack_49 = bVar7;
            if (uVar8 != 0) {
              local_d0 = *local_90 + uVar16 * 0x10;
              local_a0 = *(long *)&(this->namedConns).field_0x128 + uVar16 * 0x1e0;
              local_c8 = uVar15;
              local_c0 = uVar16;
              local_b8 = uVar13;
              local_b0 = pos0;
              local_a8 = hash;
              local_68 = cVar20;
              cStack_67 = cVar21;
              cStack_66 = cVar22;
              bStack_65 = bVar23;
              cStack_64 = cVar24;
              cStack_63 = cVar25;
              cStack_62 = cVar26;
              bStack_61 = bVar27;
              cStack_60 = cVar28;
              cStack_5f = cVar29;
              cStack_5e = cVar30;
              bStack_5d = bVar31;
              cStack_5c = cVar32;
              cStack_5b = cVar33;
              cStack_5a = cVar34;
              bStack_59 = bVar35;
              do {
                local_98 = (ulong)uVar8;
                iVar5 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
                  }
                }
                __y = (basic_string_view<char,_std::char_traits<char>_> *)
                      ((ulong)(uint)(iVar5 << 5) + local_a0);
                bVar6 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)local_108,&name,__y);
                if (bVar6) {
                  SVar11 = parsing::Token::location((Token *)(this_00 + 1));
                  pDVar10 = Scope::addDiag(local_100,(DiagCode)0x330006,SVar11);
                  Diagnostic::operator<<(pDVar10,name);
                  SVar11 = parsing::Token::location((Token *)(__y[1]._M_len + 0x60));
                  Diagnostic::addNote(pDVar10,(DiagCode)0xc0001,SVar11);
                  goto LAB_003fa5fe;
                }
                uVar8 = (uint)local_98 - 1 & (uint)local_98;
              } while (uVar8 != 0);
              bVar7 = *(byte *)(local_d0 + 0xf);
              uVar13 = local_b8;
              uVar16 = local_c0;
              uVar15 = local_c8;
              hash = local_a8;
              pos0 = local_b0;
              cVar20 = local_68;
              cVar21 = cStack_67;
              cVar22 = cStack_66;
              bVar23 = bStack_65;
              cVar24 = cStack_64;
              cVar25 = cStack_63;
              cVar26 = cStack_62;
              bVar27 = bStack_61;
              cVar28 = cStack_60;
              cVar29 = cStack_5f;
              cVar30 = cStack_5e;
              bVar31 = bStack_5d;
              cVar32 = cStack_5c;
              cVar33 = cStack_5b;
              cVar34 = cStack_5a;
              bVar35 = bStack_59;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[uVar13] & bVar7) == 0) break;
            uVar4 = *(ulong *)&(this->namedConns).field_0x118;
            lVar14 = uVar16 + uVar15;
            uVar15 = uVar15 + 1;
            uVar16 = lVar14 + 1U & uVar4;
          } while (uVar15 <= uVar4);
          if (*(ulong *)&(this->namedConns).field_0x138 < *(ulong *)&(this->namedConns).field_0x130)
          {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                             *)local_108,local_f8,pos0,hash,&local_109,&name,&local_78);
            puVar1 = &(this->namedConns).field_0x138;
            *(long *)puVar1 = *(long *)puVar1 + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                             *)local_108,hash,&local_109,&name,&local_78);
          }
        }
      }
LAB_003fa5fe:
      uVar18 = uVar18 + 1;
      bVar6 = true;
    } while (uVar18 != uVar17 >> 1);
  }
  return;
}

Assistant:

PortConnection::ConnMap::ConnMap(
    const syntax::SeparatedSyntaxList<syntax::PortConnectionSyntax>& portConnections,
    const Scope& scope, LookupLocation lookupLocation) {

    bool hasConnections = false;
    for (auto conn : portConnections) {
        bool isOrdered = conn->kind == SyntaxKind::OrderedPortConnection ||
                         conn->kind == SyntaxKind::EmptyPortConnection;
        if (!hasConnections) {
            hasConnections = true;
            usingOrdered = isOrdered;
        }
        else if (isOrdered != usingOrdered) {
            scope.addDiag(diag::MixingOrderedAndNamedPorts, conn->getFirstToken().location());
            break;
        }

        if (isOrdered) {
            orderedConns.push_back(conn);
        }
        else if (conn->kind == SyntaxKind::WildcardPortConnection) {
            if (!std::exchange(hasWildcard, true)) {
                wildcardRange = conn->sourceRange();
                wildcardAttrs = AttributeSymbol::fromSyntax(conn->attributes, scope,
                                                            lookupLocation);
            }
            else {
                auto& diag = scope.addDiag(diag::DuplicateWildcardPortConnection,
                                           conn->sourceRange());
                diag.addNote(diag::NotePreviousUsage, wildcardRange);
            }
        }
        else {
            auto& npc = conn->as<NamedPortConnectionSyntax>();
            auto name = npc.name.valueText();
            if (!name.empty()) {
                auto pair = namedConns.emplace(name, std::make_pair(&npc, false));
                if (!pair.second) {
                    auto& diag = scope.addDiag(diag::DuplicatePortConnection, npc.name.location());
                    diag << name;
                    diag.addNote(diag::NotePreviousUsage,
                                 pair.first->second.first->name.location());
                }
            }
        }
    }
}